

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

void absl::cord_internal::CordzInfo::TrackCord
               (InlineData *cord,MethodIdentifier method,int64_t sampling_stride)

{
  bool bVar1;
  CordzInfo *this;
  CordRep *rep;
  
  if (((cord->rep_).field_0.data[0] & 1U) == 0) {
    __assert_fail("cord.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0xfe,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
                 );
  }
  bVar1 = InlineData::is_profiled(cord);
  if (!bVar1) {
    this = (CordzInfo *)operator_new(0x540);
    rep = InlineData::as_tree(cord);
    CordzInfo(this,rep,(CordzInfo *)0x0,method,sampling_stride);
    InlineData::set_cordz_info(cord,this);
    Track(this);
    return;
  }
  __assert_fail("!cord.is_profiled()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0xff,
                "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
               );
}

Assistant:

void CordzInfo::TrackCord(InlineData& cord, MethodIdentifier method,
                          int64_t sampling_stride) {
  assert(cord.is_tree());
  assert(!cord.is_profiled());
  CordzInfo* cordz_info =
      new CordzInfo(cord.as_tree(), nullptr, method, sampling_stride);
  cord.set_cordz_info(cordz_info);
  cordz_info->Track();
}